

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O3

void jieba_reset_separators(jieba_t *handle,char *sep)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,sep,&local_31);
  cppjieba::Jieba::ResetSeparators((Jieba *)handle,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void jieba_reset_separators(jieba_t* handle, const char* sep) {
  ((cppjieba::Jieba*)handle)->ResetSeparators(sep);
}